

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

Expression *
lossless_neural_sound::expression_compiler::expression::operator+(Expression l,Expression r)

{
  Expression_node *pEVar1;
  Nodes *nodes;
  Arena *arena;
  Expression *in_RDI;
  Expression *this;
  Arena *in_stack_00000008;
  Nodes *in_stack_00000010;
  Expression_node *in_stack_00000018;
  double in_stack_00000020;
  Arena *in_stack_00000028;
  Nodes *in_stack_00000030;
  Expression_node *in_stack_00000038;
  Expression_node *local_38;
  Expression_node *local_30;
  
  if (in_stack_00000008 == (Arena *)0x0 && in_stack_00000028 == (Arena *)0x0) {
    in_RDI->arena = (Arena *)0x0;
    in_RDI->nodes = (Nodes *)0x0;
    in_RDI->node = (Expression_node *)0x0;
    in_RDI->constant_value = in_stack_00000020 + (double)l.arena;
  }
  else {
    nodes = in_stack_00000030;
    arena = in_stack_00000028;
    this = (Expression *)&stack0x00000008;
    if ((in_stack_00000008 == (Arena *)0x0) ||
       (nodes = in_stack_00000010, arena = in_stack_00000008, this = (Expression *)&stack0x00000028,
       in_stack_00000028 == (Arena *)0x0)) {
      Expression::get(this,arena,nodes);
    }
    if ((in_stack_00000008 != in_stack_00000028) || (in_stack_00000010 != in_stack_00000030)) {
      __assert_fail("l.is_compatible(r)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                    ,0x5c2,
                    "Expression lossless_neural_sound::expression_compiler::expression::operator+(Expression, Expression)"
                   );
    }
    local_38 = in_stack_00000018;
    local_30 = in_stack_00000038;
    pEVar1 = Sum::make(in_stack_00000008,in_stack_00000010,&local_38,2);
    in_RDI->arena = in_stack_00000008;
    in_RDI->nodes = in_stack_00000010;
    in_RDI->node = pEVar1;
  }
  return in_RDI;
}

Assistant:

Expression operator+(Expression l, Expression r)
    {
        if(!l.arena && !r.arena)
            return l.constant_value + r.constant_value;
        if(!l.arena)
            l.get(*r.arena, *r.nodes);
        else if(!r.arena)
            r.get(*l.arena, *l.nodes);
        assert(l.is_compatible(r));
        return Expression(*l.arena, *l.nodes, Sum::make(*l.arena, *l.nodes, {l.node, r.node}));
    }